

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void * __thiscall
google::protobuf::Reflection::MutableRawSplitImpl
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  CppStringType CVar5;
  void *ptr;
  Descriptor *this_01;
  string_view str;
  string_view v;
  LogMessage local_38;
  
  this_00 = &this->schema_;
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xb6c,"!schema_.InRealOneof(field)");
    str._M_str = "Field = ";
    str._M_len = 8;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_38,str);
    pcVar1 = (field->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v._M_str = pcVar1 + ~v._M_len;
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_38,v);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(this_00,field);
  PrepareSplitMessageForWrite(this,message);
  if ((this->schema_).split_offset_ == -1) {
    MutableRawSplitImpl();
  }
  else {
    uVar4 = internal::ReflectionSchema::SplitOffset(this_00);
    bVar2 = internal::SplitFieldHasExtraIndirection(field);
    this = (Reflection *)
           ((ulong)uVar3 +
           *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4));
    if (!bVar2) {
      return this;
    }
    message = (Message *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)message & 1) == 0) goto LAB_0041d022;
  }
  message = *(Message **)((ulong)message & 0xfffffffffffffffe);
LAB_0041d022:
  this_01 = this->descriptor_;
  if (this_01 == (Descriptor *)internal::kZeroBuffer) {
    if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) < 9) ||
       ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9 &&
        (CVar5 = FieldDescriptor::cpp_string_type(field), CVar5 == kCord)))) {
      if ((Arena *)message == (Arena *)0x0) {
        this_01 = (Descriptor *)operator_new(0x10);
        RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_01,(Arena *)0x0);
      }
      else {
        ptr = Arena::Allocate((Arena *)message,0x10);
        local_38._0_8_ = message;
        this_01 = (Descriptor *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
                  Construct<google::protobuf::Arena*>(ptr,(Arena **)&local_38);
      }
    }
    else if ((Arena *)message == (Arena *)0x0) {
      this_01 = (Descriptor *)operator_new(0x18);
      (((SooRep *)&this_01->super_SymbolBase)->field_0).long_rep.elements_int = 0;
      *(undefined8 *)&this_01->field_count_ = 0;
      (this_01->all_names_).payload_ = (char *)0x0;
    }
    else {
      this_01 = (Descriptor *)Arena::Allocate((Arena *)message,0x18);
      (((SooRep *)&this_01->super_SymbolBase)->field_0).long_rep.elements_int = 0;
      *(undefined8 *)&this_01->field_count_ = 0;
      (this_01->all_names_).payload_ = (char *)message;
    }
    this->descriptor_ = this_01;
  }
  return this_01;
}

Assistant:

void* Reflection::MutableRawSplitImpl(Message* message,
                                      const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  PrepareSplitMessageForWrite(message);
  void** split = MutableSplitField(message);
  if (SplitFieldHasExtraIndirection(field)) {
    return AllocIfDefault(field,
                          *GetPointerAtOffset<void*>(*split, field_offset),
                          message->GetArena());
  }
  return GetPointerAtOffset<void>(*split, field_offset);
}